

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O2

void __thiscall
DyndepParser::DyndepParser
          (DyndepParser *this,State *state,FileReader *file_reader,DyndepFile *dyndep_file)

{
  (this->super_Parser).state_ = state;
  (this->super_Parser).file_reader_ = file_reader;
  (this->super_Parser).lexer_.filename_.str_ = (char *)0x0;
  (this->super_Parser).lexer_.filename_.len_ = 0;
  (this->super_Parser).lexer_.input_.str_ = (char *)0x0;
  (this->super_Parser).lexer_.input_.len_ = 0;
  (this->super_Parser)._vptr_Parser = (_func_int **)&PTR_Parse_00133998;
  this->dyndep_file_ = dyndep_file;
  BindingEnv::BindingEnv(&this->env_);
  return;
}

Assistant:

Parser(State* state, FileReader* file_reader)
      : state_(state), file_reader_(file_reader) {}